

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_LinkedModel_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/LinkedModel.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_Parameters_2eproto::InitDefaults();
  LinkedModel::LinkedModel((LinkedModel *)&_LinkedModel_default_instance_);
  DAT_007264c0 = 1;
  LinkedModelFile::LinkedModelFile((LinkedModelFile *)&_LinkedModelFile_default_instance_);
  DAT_007264f8 = 1;
  DAT_007264e0 = &_StringParameter_default_instance_;
  DAT_007264e8 = &_StringParameter_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_Parameters_2eproto::InitDefaults();
  _LinkedModel_default_instance_.DefaultConstruct();
  _LinkedModelFile_default_instance_.DefaultConstruct();
  _LinkedModelFile_default_instance_.get_mutable()->linkedmodelfilename_ = const_cast< ::CoreML::Specification::StringParameter*>(
      ::CoreML::Specification::StringParameter::internal_default_instance());
  _LinkedModelFile_default_instance_.get_mutable()->linkedmodelsearchpath_ = const_cast< ::CoreML::Specification::StringParameter*>(
      ::CoreML::Specification::StringParameter::internal_default_instance());
}